

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O1

bool __thiscall
bssl::tls1_configure_aead
          (bssl *this,SSL *ssl,evp_aead_direction_t direction,Array<unsigned_char> *key_block_cache,
          SSL_SESSION *session,Span<const_unsigned_char> iv_override)

{
  ulong uVar1;
  uchar *puVar2;
  size_t new_size;
  Span<const_unsigned_char> mac_key;
  Span<const_unsigned_char> fixed_iv;
  bool bVar3;
  undefined1 uVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  Array<unsigned_char> *this_00;
  ulong uVar6;
  SSL_SESSION *session_00;
  size_t in_R9;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *this_01;
  Span<const_unsigned_char> enc_key;
  Span<unsigned_char> out;
  UniquePtr<SSLAEADContext> aead_ctx;
  size_t iv_len;
  size_t mac_secret_len;
  size_t key_len;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_90;
  ulong local_88;
  size_t local_80;
  SSL_SESSION *local_78;
  ulong local_70;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_68;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_60;
  size_t local_58;
  SSL_SESSION *local_50;
  size_t sStack_48;
  uchar *local_40;
  ulong uStack_38;
  
  this_00 = (Array<unsigned_char> *)CONCAT44(in_register_00000014,direction);
  session_00 = (SSL_SESSION *)key_block_cache[0xd].size_;
  bVar3 = get_key_block_lengths((SSL *)this,&local_70,&local_58,&local_88,(SSL_CIPHER *)session_00);
  if ((bVar3) &&
     ((new_size = (local_70 + local_58 + local_88) * 2, local_80 = in_R9, local_78 = session,
      this_00->size_ != 0 ||
      ((bVar3 = Array<unsigned_char>::InitUninitialized(this_00,new_size), bVar3 &&
       (out.size_ = (size_t)key_block_cache, out.data_ = (uchar *)this_00->size_,
       bVar3 = generate_key_block(this,(SSL *)this_00->data_,out,session_00), bVar3)))))) {
    uVar1 = this_00->size_;
    if (uVar1 != new_size) {
      __assert_fail("key_block_cache->size() == key_block_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                    ,100,
                    "bool bssl::tls1_configure_aead(SSL *, evp_aead_direction_t, Array<uint8_t> *, const SSL_SESSION *, Span<const uint8_t>)"
                   );
    }
    puVar2 = this_00->data_;
    if ((~*(uint *)(this + 0xa4) & 1) == (uint)ssl) {
      uStack_38 = local_70;
      if (uVar1 < local_70) {
        uStack_38 = uVar1;
      }
      uVar5 = local_70 * 2;
      if ((uVar1 < uVar5) || (uVar6 = (local_70 + local_58) * 2, local_40 = puVar2, uVar1 < uVar6))
      goto LAB_00161d0c;
    }
    else {
      if ((uVar1 < local_70) || (uVar5 = local_70 * 2 + local_58, uVar1 < uVar5)) {
LAB_00161d0c:
        abort();
      }
      uStack_38 = uVar1 - local_70;
      if (local_70 <= uVar1 - local_70) {
        uStack_38 = local_70;
      }
      uVar6 = local_88 + (local_70 + local_58) * 2;
      if (uVar1 < uVar6) goto LAB_00161d0c;
      local_40 = puVar2 + local_70;
    }
    sStack_48 = uVar1 - uVar6;
    if (local_88 <= uVar1 - uVar6) {
      sStack_48 = local_88;
    }
    if (local_80 == 0) {
      local_78 = (SSL_SESSION *)(puVar2 + uVar6);
    }
    else {
      sStack_48 = local_80;
      if (local_88 != local_80) goto LAB_00161c0e;
    }
    enc_key.size_ = puVar2 + uVar5;
    local_50 = local_78;
    mac_key.size_ = uStack_38;
    mac_key.data_ = local_40;
    fixed_iv.size_ = sStack_48;
    fixed_iv.data_ = (uchar *)local_78;
    enc_key.data_ = (uchar *)key_block_cache[0xd].size_;
    SSLAEADContext::Create
              ((evp_aead_direction_t)&local_90,(uint16_t)ssl,
               (SSL_CIPHER *)(ulong)*(ushort *)(*(long *)(this + 0x30) + 0xd0),enc_key,mac_key,
               fixed_iv);
    if (local_90._M_head_impl == (SSLAEADContext *)0x0) {
      uVar4 = 0;
    }
    else {
      if ((uint)ssl == 0) {
        this_01 = &local_60;
        local_60._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             local_90._M_head_impl;
        local_90._M_head_impl = (SSLAEADContext *)0x0;
        uVar4 = (**(code **)(*(long *)this + 0x98))(this,3,this_01,0,0);
      }
      else {
        this_01 = &local_68;
        local_68._M_t.super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<bssl::SSLAEADContext,_bssl::internal::Deleter,_true,_true>)
             local_90._M_head_impl;
        local_90._M_head_impl = (SSLAEADContext *)0x0;
        uVar4 = (**(code **)(*(long *)this + 0xa0))(this,3,this_01,0,0);
      }
      std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(this_01);
    }
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_90);
  }
  else {
LAB_00161c0e:
    uVar4 = 0;
  }
  return (bool)uVar4;
}

Assistant:

bool tls1_configure_aead(SSL *ssl, evp_aead_direction_t direction,
                         Array<uint8_t> *key_block_cache,
                         const SSL_SESSION *session,
                         Span<const uint8_t> iv_override) {
  size_t mac_secret_len, key_len, iv_len;
  if (!get_key_block_lengths(ssl, &mac_secret_len, &key_len, &iv_len,
                             session->cipher)) {
    return false;
  }

  // Ensure that |key_block_cache| is set up.
  const size_t key_block_size = 2 * (mac_secret_len + key_len + iv_len);
  if (key_block_cache->empty()) {
    if (!key_block_cache->InitForOverwrite(key_block_size) ||
        !generate_key_block(ssl, Span(*key_block_cache), session)) {
      return false;
    }
  }
  assert(key_block_cache->size() == key_block_size);

  Span<const uint8_t> key_block = *key_block_cache;
  Span<const uint8_t> mac_secret, key, iv;
  if (direction == (ssl->server ? evp_aead_open : evp_aead_seal)) {
    // Use the client write (server read) keys.
    mac_secret = key_block.subspan(0, mac_secret_len);
    key = key_block.subspan(2 * mac_secret_len, key_len);
    iv = key_block.subspan(2 * mac_secret_len + 2 * key_len, iv_len);
  } else {
    // Use the server write (client read) keys.
    mac_secret = key_block.subspan(mac_secret_len, mac_secret_len);
    key = key_block.subspan(2 * mac_secret_len + key_len, key_len);
    iv = key_block.subspan(2 * mac_secret_len + 2 * key_len + iv_len, iv_len);
  }

  if (!iv_override.empty()) {
    if (iv_override.size() != iv_len) {
      return false;
    }
    iv = iv_override;
  }

  UniquePtr<SSLAEADContext> aead_ctx = SSLAEADContext::Create(
      direction, ssl->s3->version, session->cipher, key, mac_secret, iv);
  if (!aead_ctx) {
    return false;
  }

  if (direction == evp_aead_open) {
    return ssl->method->set_read_state(ssl, ssl_encryption_application,
                                       std::move(aead_ctx),
                                       /*traffic_secret=*/{});
  }

  return ssl->method->set_write_state(ssl, ssl_encryption_application,
                                      std::move(aead_ctx),
                                      /*traffic_secret=*/{});
}